

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long *plVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string base_variable_string;
  string base_var_type;
  string shader_source;
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined8 local_48;
  long local_40;
  SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  local_38 = this;
  if (supported_variable_types_map._16_8_ != 0) {
    iVar1 = *(int *)Interface::ES::var_types;
    local_40 = 0x21f1cb8;
    lVar2 = supported_variable_types_map._16_8_;
    do {
      if (iVar1 <= *(int *)(lVar2 + 0x20)) {
        local_40 = lVar2;
      }
      lVar2 = *(long *)(lVar2 + 0x10 + (ulong)(*(int *)(lVar2 + 0x20) < iVar1) * 8);
    } while (lVar2 != 0);
    if ((local_40 != 0x21f1cb8) && (*(int *)(local_40 + 0x20) <= iVar1)) {
      local_48 = 0;
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*(long *)(local_40 + 0x28),
                 *(long *)(local_40 + 0x30) + *(long *)(local_40 + 0x28));
      local_c8[0] = local_b8;
      std::__cxx11::string::_M_construct<char*>((string *)local_c8,local_88,local_88 + local_80);
      uVar7 = 0;
      local_68[0] = local_58;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_68,0x1af8059);
      local_108[0] = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_108,shader_start_abi_cxx11_,DAT_021ec698 + shader_start_abi_cxx11_)
      ;
      std::__cxx11::string::append((char *)local_108);
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_108,(ulong)local_c8[0]);
      local_e8 = &local_d8;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_d8 = *plVar6;
        lStack_d0 = plVar3[3];
      }
      else {
        local_d8 = *plVar6;
        local_e8 = (long *)*plVar3;
      }
      local_e0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_e8);
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_98 = *plVar6;
        lStack_90 = plVar3[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *plVar6;
        local_a8 = (long *)*plVar3;
      }
      local_a0 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_68,(ulong)local_a8);
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_108[0] != local_f8) {
        operator_delete(local_108[0],local_f8[0] + 1);
      }
      do {
        std::__cxx11::string::append((char *)local_68);
        uVar7 = uVar7 + 1;
      } while (uVar7 < 2);
      std::__cxx11::string::append((char *)local_68);
      if (tested_shader_type < SHADER_TYPE_LAST) {
        puVar4 = &set_tesseation_abi_cxx11_;
        switch((ulong)tested_shader_type) {
        case 1:
          std::__cxx11::string::append((char *)local_68);
          break;
        case 3:
          puVar4 = &emit_quad_abi_cxx11_;
        case 4:
          std::__cxx11::string::_M_append((char *)local_68,*puVar4);
        }
        std::__cxx11::string::_M_append((char *)local_68,shader_end_abi_cxx11_);
        (*(code *)(&DAT_01ad2f60 + *(int *)(&DAT_01ad2f60 + (ulong)tested_shader_type * 4)))();
        return;
      }
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x51d);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Type not found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
             ,0x529);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SizedDeclarationsPrimitive<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			/* Loop round for each var_types ("int", "uint", "float", etc.)
			 * We are testing a[][] to a [][][][][][][][], so start counter at 2. */
			for (size_t max_dimension_limit = 2; max_dimension_limit <= API::MAX_ARRAY_DIMENSIONS;
				 max_dimension_limit++)
			{
				// Record the base varTypeModifier + varType
				std::string base_var_type		 = var_iterator->second.type;
				std::string base_variable_string = base_var_type;

				for (size_t base_sub_script_index = 0; base_sub_script_index <= max_dimension_limit;
					 base_sub_script_index++)
				{
					std::string shader_source = "";

					// Add the shader body start, and the base varTypeModifier + varType + variable name.
					shader_source += shader_start + "    " + base_variable_string + " a";

					for (size_t remaining_sub_script_index = base_sub_script_index;
						 remaining_sub_script_index < max_dimension_limit; remaining_sub_script_index++)
					{
						/* Add as many array sub_scripts as we can, up to the current dimension limit. */
						shader_source += "[2]";
					}

					/* End line */
					shader_source += ";\n";

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test */
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

					/* From now on, we'll have an extra sub_script each time. */
					base_variable_string += "[2]";
				} /* for (int base_sub_script_index = 0; ...) */
			}	 /* for (int max_dimension_limit = 2; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}